

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O0

Curl_tree * Curl_splayinsert(timeval i,Curl_tree *t,Curl_tree *node)

{
  long lVar1;
  long lVar2;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  Curl_tree *node_local;
  Curl_tree *t_local;
  timeval i_local;
  
  lVar1 = i.tv_usec;
  lVar2 = i.tv_sec;
  i_local.tv_usec = (__suseconds_t)t;
  if (node != (Curl_tree *)0x0) {
    node_local = t;
    if (t != (Curl_tree *)0x0) {
      node_local = Curl_splay(i,t);
      if (lVar2 < (node_local->key).tv_sec) {
        local_34 = 0xffffffff;
      }
      else {
        if ((node_local->key).tv_sec < lVar2) {
          local_38 = 1;
        }
        else {
          if (lVar1 < (node_local->key).tv_usec) {
            local_3c = 0xffffffff;
          }
          else {
            local_3c = (uint)((node_local->key).tv_usec < lVar1);
          }
          local_38 = local_3c;
        }
        local_34 = local_38;
      }
      if (local_34 == 0) {
        node->same = node_local;
        (node->key).tv_sec = lVar2;
        (node->key).tv_usec = lVar1;
        node->smaller = node_local->smaller;
        node->larger = node_local->larger;
        node_local->smaller = node;
        (node_local->key).tv_sec = -1;
        (node_local->key).tv_usec = -1;
        return node;
      }
    }
    if (node_local == (Curl_tree *)0x0) {
      node->larger = (Curl_tree *)0x0;
      node->smaller = (Curl_tree *)0x0;
    }
    else {
      if (lVar2 < (node_local->key).tv_sec) {
        local_40 = 0xffffffff;
      }
      else {
        if ((node_local->key).tv_sec < lVar2) {
          local_44 = 1;
        }
        else {
          if (lVar1 < (node_local->key).tv_usec) {
            local_48 = 0xffffffff;
          }
          else {
            local_48 = (uint)((node_local->key).tv_usec < lVar1);
          }
          local_44 = local_48;
        }
        local_40 = local_44;
      }
      if ((int)local_40 < 0) {
        node->smaller = node_local->smaller;
        node->larger = node_local;
        node_local->smaller = (Curl_tree *)0x0;
      }
      else {
        node->larger = node_local->larger;
        node->smaller = node_local;
        node_local->larger = (Curl_tree *)0x0;
      }
    }
    (node->key).tv_sec = lVar2;
    (node->key).tv_usec = lVar1;
    node->same = (Curl_tree *)0x0;
    i_local.tv_usec = (__suseconds_t)node;
  }
  return (Curl_tree *)i_local.tv_usec;
}

Assistant:

struct Curl_tree *Curl_splayinsert(struct timeval i,
                                   struct Curl_tree *t,
                                   struct Curl_tree *node)
{
  static const struct timeval KEY_NOTUSED = {-1, -1}; /* will *NEVER* appear */

  if(node == NULL)
    return t;

  if(t != NULL) {
    t = Curl_splay(i, t);
    if(compare(i, t->key)==0) {
      /* There already exists a node in the tree with the very same key. Build
         a linked list of nodes. We make the new 'node' struct the new master
         node and make the previous node the first one in the 'same' list. */

      node->same = t;
      node->key = i;
      node->smaller = t->smaller;
      node->larger = t->larger;

      t->smaller = node; /* in the sub node for this same key, we use the
                            smaller pointer to point back to the master
                            node */

      t->key = KEY_NOTUSED; /* and we set the key in the sub node to NOTUSED
                               to quickly identify this node as a subnode */

      return node; /* new root node */
    }
  }

  if(t == NULL) {
    node->smaller = node->larger = NULL;
  }
  else if(compare(i, t->key) < 0) {
    node->smaller = t->smaller;
    node->larger = t;
    t->smaller = NULL;

  }
  else {
    node->larger = t->larger;
    node->smaller = t;
    t->larger = NULL;
  }
  node->key = i;

  node->same = NULL; /* no identical node (yet) */
  return node;
}